

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_flags_decoder.c
# Opt level: O0

lzma_ret lzma_stream_footer_decode(lzma_stream_flags *options,uint8_t *in)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t crc;
  uint8_t *in_local;
  lzma_stream_flags *options_local;
  
  if (*(uint8_t (*) [2])(in + 10) == (uint8_t  [2])0x5a59) {
    uVar2 = lzma_crc32(in + 4,6,0);
    uVar3 = read32le(in);
    if (uVar2 == uVar3) {
      _Var1 = stream_flags_decode(options,in + 8);
      if (_Var1) {
        options_local._4_4_ = LZMA_OPTIONS_ERROR;
      }
      else {
        uVar2 = read32le(in + 4);
        options->backward_size = (ulong)uVar2;
        options->backward_size = (options->backward_size + 1) * 4;
        options_local._4_4_ = LZMA_OK;
      }
    }
    else {
      options_local._4_4_ = LZMA_DATA_ERROR;
    }
  }
  else {
    options_local._4_4_ = LZMA_FORMAT_ERROR;
  }
  return options_local._4_4_;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_stream_footer_decode(lzma_stream_flags *options, const uint8_t *in)
{
	uint32_t crc;

	// Magic
	if (memcmp(in + sizeof(uint32_t) * 2 + LZMA_STREAM_FLAGS_SIZE,
			lzma_footer_magic, sizeof(lzma_footer_magic)) != 0)
		return LZMA_FORMAT_ERROR;

	// CRC32
	crc = lzma_crc32(in + sizeof(uint32_t),
			sizeof(uint32_t) + LZMA_STREAM_FLAGS_SIZE, 0);
	if (crc != unaligned_read32le(in))
		return LZMA_DATA_ERROR;

	// Stream Flags
	if (stream_flags_decode(options, in + sizeof(uint32_t) * 2))
		return LZMA_OPTIONS_ERROR;

	// Backward Size
	options->backward_size = unaligned_read32le(in + sizeof(uint32_t));
	options->backward_size = (options->backward_size + 1) * 4;

	return LZMA_OK;
}